

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O2

void Am_Scripting_Register_Palette
               (Am_Object *undo_handler,Am_Object *palette,Am_Value *slot_or_type)

{
  Am_Slot_Key key;
  Am_Value *list_value;
  Am_Wrapper *pAVar1;
  ostream *poVar2;
  Am_Assoc as;
  Am_Value_List palette_registry;
  
  if (slot_or_type->type == 0x4015) {
    Am_Object::Set(palette,0x19c,slot_or_type,1);
  }
  list_value = Am_Object::Get(undo_handler,Am_REGISTRY_FOR_PALETTES,3);
  Am_Value_List::Am_Value_List(&palette_registry,list_value);
  pAVar1 = Am_Object::operator_cast_to_Am_Wrapper_(palette);
  Am_Assoc::Am_Assoc(&as,pAVar1,slot_or_type);
  pAVar1 = Am_Assoc::operator_cast_to_Am_Wrapper_(&as);
  Am_Value_List::Add(&palette_registry,pAVar1,Am_TAIL,true);
  key = Am_REGISTRY_FOR_PALETTES;
  pAVar1 = Am_Value_List::operator_cast_to_Am_Wrapper_(&palette_registry);
  Am_Object::Set(undo_handler,key,pAVar1,1);
  if (am_sdebug == true) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Registering palette ");
    poVar2 = operator<<(poVar2,palette);
    poVar2 = std::operator<<(poVar2," for ");
    poVar2 = operator<<(poVar2,slot_or_type);
    poVar2 = std::operator<<(poVar2," to ");
    poVar2 = operator<<(poVar2,undo_handler);
    poVar2 = std::operator<<(poVar2," got new list ");
    poVar2 = operator<<(poVar2,&palette_registry);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::ostream::flush();
  }
  Am_Assoc::~Am_Assoc(&as);
  Am_Value_List::~Am_Value_List(&palette_registry);
  return;
}

Assistant:

void
Am_Scripting_Register_Palette(Am_Object undo_handler, Am_Object palette,
                              Am_Value slot_or_type)
{
  if (Am_Am_Slot_Key::Test(slot_or_type)) {
    palette.Set(Am_SLOT_FOR_VALUE, slot_or_type, Am_OK_IF_NOT_THERE);
  }
  Am_Value_List palette_registry =
      undo_handler.Get(Am_REGISTRY_FOR_PALETTES, Am_RETURN_ZERO_ON_ERROR);
  Am_Assoc as(palette, slot_or_type);
  palette_registry.Add(as);
  undo_handler.Set(Am_REGISTRY_FOR_PALETTES, palette_registry,
                   Am_OK_IF_NOT_THERE);
  if (am_sdebug)
    std::cout << "Registering palette " << palette << " for " << slot_or_type
              << " to " << undo_handler << " got new list " << palette_registry
              << std::endl
              << std::flush;
}